

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strto64_base
          (numbers_internal *this,string_view text,Nonnull<int64_t_*> value,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  bool local_35;
  uint local_34;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = (char *)text._M_len;
  local_34 = (uint)value;
  *(long *)text._M_str = 0;
  local_30._M_len = (size_t)this;
  bVar3 = anon_unknown_0::safe_parse_sign_and_base(&local_30,(Nonnull<int_*>)&local_34,&local_35);
  if (bVar3) {
    uVar7 = CONCAT44(0,local_34);
    if (local_35 == false) {
      if ((int)local_34 < 0) {
        __assert_fail("base >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0x3da,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                     );
      }
      if ((1 < local_34) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = uVar7,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) !=
         *(long *)((anonymous_namespace)::LookupTables<long>::kVmaxOverBase + uVar7 * 8))) {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0x3df,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                     );
      }
      local_30._M_len = local_30._M_len + (long)local_30._M_str;
      lVar5 = 0;
      while( true ) {
        bVar3 = local_30._M_len <= local_30._M_str;
        if ((bVar3) ||
           (lVar8 = (long)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_30._M_str],
           (long)uVar7 <= lVar8)) goto LAB_002427f9;
        if ((*(long *)((anonymous_namespace)::LookupTables<long>::kVmaxOverBase + uVar7 * 8) < lVar5
            ) || (lVar5 = lVar5 * uVar7,
                 lVar5 - (0x7fffffffffffffff - lVar8) != 0 && 0x7fffffffffffffff - lVar8 <= lVar5))
        break;
        lVar5 = lVar5 + lVar8;
        local_30._M_str = (char *)((numbers_internal *)local_30._M_str + 1);
      }
      lVar5 = 0x7fffffffffffffff;
    }
    else {
      lVar8 = (long)(int)local_34;
      if ((1 < (int)local_34) &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = SUB168(SEXT816(-0x8000000000000000),8),
         SUB168((auVar2 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816(lVar8),0) !=
         *(long *)((anonymous_namespace)::LookupTables<long>::kVminOverBase + lVar8 * 8))) {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0x402,
                      "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                     );
      }
      local_30._M_len = local_30._M_len + (long)local_30._M_str;
      for (lVar4 = 0;
          ((bVar3 = local_30._M_len <= local_30._M_str, lVar5 = lVar4, !bVar3 &&
           (iVar6 = (int)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_30._M_str],
           iVar6 < (int)local_34)) &&
          (lVar5 = -0x8000000000000000,
          *(long *)((anonymous_namespace)::LookupTables<long>::kVminOverBase + lVar8 * 8) <= lVar4))
          ; lVar4 = lVar4 * lVar8 - (long)iVar6) {
        if (lVar4 * lVar8 < (long)((long)iVar6 | 0x8000000000000000U)) break;
        local_30._M_str = (char *)((numbers_internal *)local_30._M_str + 1);
      }
    }
LAB_002427f9:
    *(long *)text._M_str = lVar5;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool safe_strto64_base(absl::string_view text, absl::Nonnull<int64_t*> value,
                       int base) {
  return safe_int_internal<int64_t>(text, value, base);
}